

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::reportError
          (DOMLSSerializerImpl *this,DOMNode *errorNode,ErrorSeverity errorType,XMLCh *errorMsg)

{
  byte bVar1;
  undefined1 local_98 [8];
  DOMErrorImpl domError;
  DOMLocatorImpl locator;
  bool toContinueProcess;
  XMLCh *errorMsg_local;
  ErrorSeverity errorType_local;
  DOMNode *errorNode_local;
  DOMLSSerializerImpl *this_local;
  
  locator.fURI._7_1_ = true;
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    DOMLocatorImpl::DOMLocatorImpl
              ((DOMLocatorImpl *)&domError.fRelatedData,0,0,errorNode,(XMLCh *)0x0,
               0xffffffffffffffff,0xffffffffffffffff);
    DOMErrorImpl::DOMErrorImpl
              ((DOMErrorImpl *)local_98,errorType,errorMsg,(DOMLocator *)&domError.fRelatedData);
    bVar1 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,local_98);
    locator.fURI._7_1_ = (bool)(bVar1 & 1);
    DOMErrorImpl::~DOMErrorImpl((DOMErrorImpl *)local_98);
    DOMLocatorImpl::~DOMLocatorImpl((DOMLocatorImpl *)&domError.fRelatedData);
  }
  if (errorType != DOM_SEVERITY_WARNING) {
    this->fErrorCount = this->fErrorCount + 1;
  }
  return locator.fURI._7_1_;
}

Assistant:

bool DOMLSSerializerImpl::reportError(const DOMNode* const    errorNode
                              , DOMError::ErrorSeverity errorType
                              , const XMLCh*   const    errorMsg)
{
    bool toContinueProcess = true;   // default value for no error handler

    if (fErrorHandler)
    {
        DOMLocatorImpl  locator(0, 0, (DOMNode*) errorNode, 0);
        DOMErrorImpl    domError(errorType , errorMsg, &locator);
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
    }

    if (errorType != DOMError::DOM_SEVERITY_WARNING)
        fErrorCount++;

    return toContinueProcess;
}